

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_record_field_set_type(coda_type_record_field *field,coda_type *type)

{
  undefined8 uVar1;
  char *message;
  
  if (field == (coda_type_record_field *)0x0) {
    message = "field argument is NULL (%s:%u)";
    uVar1 = 0x430;
  }
  else {
    if (type != (coda_type *)0x0) {
      if (field->type != (coda_type *)0x0) {
        coda_set_error(-400,"field already has a type");
        return -1;
      }
      field->type = type;
      type->retain_count = type->retain_count + 1;
      return 0;
    }
    message = "type argument is NULL (%s:%u)";
    uVar1 = 0x435;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar1);
  return -1;
}

Assistant:

int coda_type_record_field_set_type(coda_type_record_field *field, coda_type *type)
{
    if (field == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (field->type != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "field already has a type");
        return -1;
    }
    field->type = type;
    type->retain_count++;
    return 0;
}